

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsNonSemanticInstruction(Instruction *this)

{
  IRContext *this_00;
  DefUseManager *this_01;
  uint32_t uVar1;
  Instruction *this_02;
  Operand *this_03;
  long lVar2;
  bool bVar3;
  string import_name;
  string local_38;
  
  bVar3 = false;
  if ((this->has_result_id_ == true) && (bVar3 = false, this->opcode_ == OpExtInst)) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar1 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar1 = (uint)this->has_result_id_;
    }
    uVar1 = GetSingleWordOperand(this,uVar1);
    this_02 = analysis::DefUseManager::GetDef(this_01,uVar1);
    this_03 = GetInOperand(this_02,0);
    Operand::AsString_abi_cxx11_(&local_38,this_03);
    lVar2 = std::__cxx11::string::find((char *)&local_38,0x8be3e3,0);
    bVar3 = lVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3;
}

Assistant:

bool Instruction::IsNonSemanticInstruction() const {
  if (!HasResultId()) return false;
  if (opcode() != spv::Op::OpExtInst) return false;

  auto import_inst =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(0));
  std::string import_name = import_inst->GetInOperand(0).AsString();
  return import_name.find("NonSemantic.") == 0;
}